

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  ModuleField *pMVar1;
  bool bVar2;
  Result RVar3;
  pointer *__ptr;
  ModuleField *local_68;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_60;
  ModuleFieldList *local_58;
  Location local_50;
  
  local_58 = fields;
  while( true ) {
    bVar2 = PeekMatchLpar(this,Export);
    if (!bVar2) {
      return (Result)Ok;
    }
    RVar3 = Expect(this,Lpar);
    if (RVar3.enum_ == Error) break;
    GetLocation(&local_50,this);
    MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_68,&local_50);
    *(ExternalKind *)&local_68[1].loc.filename.size_ = kind;
    RVar3 = Expect(this,Export);
    if (((RVar3.enum_ == Error) ||
        (RVar3 = ParseQuotedText(this,(string *)(local_68 + 1)), RVar3.enum_ == Error)) ||
       (RVar3 = Expect(this,Rpar), pMVar1 = local_68, RVar3.enum_ == Error)) {
      bVar2 = false;
    }
    else {
      local_68 = (ModuleField *)0x0;
      local_60._M_head_impl = pMVar1;
      intrusive_list<wabt::ModuleField>::push_back
                (local_58,(unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                          &local_60);
      if (local_60._M_head_impl != (ModuleField *)0x0) {
        (*(local_60._M_head_impl)->_vptr_ModuleField[1])();
      }
      local_60._M_head_impl = (ModuleField *)0x0;
      bVar2 = true;
    }
    if (local_68 != (ModuleField *)0x0) {
      (*local_68->_vptr_ModuleField[1])();
    }
    if (!bVar2) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = MakeUnique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}